

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharClassifier.h
# Opt level: O1

OLECHAR * __thiscall
Js::CharClassifier::SkipWhiteSpace(CharClassifier *this,LPCOLESTR pStr,LPCOLESTR pStrEnd)

{
  OLECHAR OVar1;
  bool bVar2;
  OLECHAR *pOVar3;
  
  if (pStr != pStrEnd) {
    OVar1 = *pStr;
    bVar2 = IsWhiteSpace(this,(uint)(ushort)OVar1);
    if (bVar2) {
LAB_00d2d9ab:
      pOVar3 = (*this->skipWhiteSpaceStartEndFunc)(pStr,pStrEnd,this);
      return pOVar3;
    }
    if (this->skipWhiteSpaceStartEndFunc == SkipWhiteSpaceSurrogateStartEnd) {
      bVar2 = NumberUtilities::IsSurrogateLowerPart((uint)(ushort)OVar1);
      if (bVar2) goto LAB_00d2d9ab;
    }
  }
  return pStr;
}

Assistant:

const OLECHAR* SkipWhiteSpace(_In_reads_(pStrEnd - pStr) LPCOLESTR pStr, _In_ LPCOLESTR pStrEnd) const
        {
            // Fast path for the case in which first character is not space
            if (pStr == pStrEnd)
            {
                return pStr;
            }
            char16 firstChar = *pStr;
            if (!this->IsWhiteSpace(firstChar) &&
                (skipWhiteSpaceStartEndFunc != &SkipWhiteSpaceSurrogateStartEnd
                || !Js::NumberUtilities::IsSurrogateLowerPart(firstChar)))
            {
                return pStr;
            }
            return skipWhiteSpaceStartEndFunc(pStr, pStrEnd, this);
        }